

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

void __thiscall
std::pair<GF2::MM<45UL>,_GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::pair
          (pair<GF2::MM<45UL>,_GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *this,
          pair<GF2::MM<45UL>,_GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *param_2)

{
  MP<45UL,_GF2::MOGrlex<45UL>_> *pMVar1;
  MP<45UL,_GF2::MOGrlex<45UL>_> *pMVar2;
  _List_node_base *p_Var3;
  
  (this->first).super_WW<45UL>._words[0] = (param_2->first).super_WW<45UL>._words[0];
  pMVar1 = &this->second;
  pMVar2 = &param_2->second;
  (this->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (param_2->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
       super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  p_Var3 = (param_2->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
           super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  (this->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = p_Var3;
  (this->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size =
       (param_2->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
       super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size;
  if ((param_2->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
      super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)pMVar2) {
    p_Var3->_M_next = (_List_node_base *)pMVar1;
    ((pMVar1->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
     super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
     super__List_node_base._M_next)->_M_prev = (_List_node_base *)pMVar1;
    (param_2->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
    super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)pMVar2;
    (param_2->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
    super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pMVar2;
    (param_2->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
    super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size = 0;
    return;
  }
  (this->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)pMVar1;
  (this->second).super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pMVar1;
  return;
}

Assistant:

WW(const WW& wRight)
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			_words[pos] = wRight._words[pos];
	}